

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformDefinitions
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  ostream *poVar1;
  stringstream stream;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198;
  
  getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,"layout(std140) uniform ");
  poVar1 = std::operator<<(poVar1,m_uniform_block_name);
  std::operator<<(poVar1,"\n{\n");
  poVar1 = std::operator<<(&local_198,"    ");
  poVar1 = std::operator<<(poVar1,(string *)&uniform_type->m_type_name);
  poVar1 = std::operator<<(poVar1," uniform_array[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"];\n");
  std::operator<<(&local_198,"};\n\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_source_code,asStack_1c8);
  std::__cxx11::string::~string(asStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformDefinitions(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
												   std::string& out_source_code) const
{
	const glw::GLuint n_uniforms = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * layout(std140) uniform M_UNIFORM_BLOCK_NAME
	 * {
	 *     TYPE_NAME uniform_array[N_UNIFORMS];
	 * };
	 */
	stream << "layout(std140) uniform " << m_uniform_block_name << "\n"
																   "{\n";

	stream << "    " << uniform_type.m_type_name << " uniform_array[" << n_uniforms << "];\n";

	stream << "};\n\n";

	out_source_code = stream.str();
}